

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O1

value * helics::fileops::loadToml(value *__return_storage_ptr__,string *tomlString)

{
  string fname;
  spec s;
  char cVar1;
  ifstream file;
  undefined8 in_stack_fffffffffffffd90;
  undefined1 *puVar2;
  undefined8 in_stack_fffffffffffffda0;
  long in_stack_fffffffffffffda8;
  semantic_version local_248;
  spec local_238;
  istream local_220 [520];
  
  if (tomlString->_M_string_length < 0x81) {
    std::ifstream::ifstream(local_220,(string *)tomlString,_S_bin);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      loadTomlStr(__return_storage_ptr__,tomlString);
    }
    else {
      puVar2 = &stack0xfffffffffffffda8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffd98,"unknown file","");
      local_248.major = 1;
      local_248.minor = 0;
      local_248.patch = 0;
      toml::spec::spec(&local_238,&local_248);
      fname._M_string_length._0_4_ = local_238.version.patch;
      fname._M_string_length._4_1_ = local_238.v1_1_0_allow_control_characters_in_comments;
      fname._M_string_length._5_1_ = local_238.v1_1_0_allow_newlines_in_inline_tables;
      fname._M_string_length._6_1_ = local_238.v1_1_0_allow_trailing_comma_in_inline_tables;
      fname._M_string_length._7_1_ = local_238.v1_1_0_allow_non_english_in_bare_keys;
      fname._M_dataplus._M_p = (pointer)local_238.version._0_8_;
      fname.field_2._0_1_ = local_238.v1_1_0_add_escape_sequence_e;
      fname.field_2._1_1_ = local_238.v1_1_0_add_escape_sequence_x;
      fname.field_2._2_1_ = local_238.v1_1_0_make_seconds_optional;
      fname.field_2._3_1_ = local_238.ext_hex_float;
      fname.field_2._4_1_ = local_238.ext_num_suffix;
      fname.field_2._5_1_ = local_238.ext_null_value;
      fname.field_2._6_2_ = local_238._22_2_;
      fname.field_2._8_8_ = in_stack_fffffffffffffd90;
      s.version.patch = (int)in_stack_fffffffffffffda0;
      s.v1_1_0_allow_control_characters_in_comments =
           (bool)(char)((ulong)in_stack_fffffffffffffda0 >> 0x20);
      s.v1_1_0_allow_newlines_in_inline_tables =
           (bool)(char)((ulong)in_stack_fffffffffffffda0 >> 0x28);
      s.v1_1_0_allow_trailing_comma_in_inline_tables =
           (bool)(char)((ulong)in_stack_fffffffffffffda0 >> 0x30);
      s.v1_1_0_allow_non_english_in_bare_keys =
           (bool)(char)((ulong)in_stack_fffffffffffffda0 >> 0x38);
      s.version._0_8_ = puVar2;
      s.v1_1_0_add_escape_sequence_e = (bool)(char)in_stack_fffffffffffffda8;
      s.v1_1_0_add_escape_sequence_x = (bool)(char)((ulong)in_stack_fffffffffffffda8 >> 8);
      s.v1_1_0_make_seconds_optional = (bool)(char)((ulong)in_stack_fffffffffffffda8 >> 0x10);
      s.ext_hex_float = (bool)(char)((ulong)in_stack_fffffffffffffda8 >> 0x18);
      s.ext_num_suffix = (bool)(char)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      s.ext_null_value = (bool)(char)((ulong)in_stack_fffffffffffffda8 >> 0x28);
      s._22_2_ = (short)((ulong)in_stack_fffffffffffffda8 >> 0x30);
      toml::parse<toml::type_config>(__return_storage_ptr__,local_220,fname,s);
      if (puVar2 != &stack0xfffffffffffffda8) {
        operator_delete(puVar2,in_stack_fffffffffffffda8 + 1);
      }
    }
    std::ifstream::~ifstream(local_220);
  }
  else {
    loadTomlStr(__return_storage_ptr__,tomlString);
  }
  return __return_storage_ptr__;
}

Assistant:

toml::value loadToml(const std::string& tomlString)
{
    if (tomlString.size() > 128) {
        try {
            return loadTomlStr(tomlString);
        }
        catch (const std::invalid_argument&) {
            ;  // just pass through this was an assumption
        }
    }
    std::ifstream file(tomlString, std::ios_base::binary);

    try {
        if (file.is_open()) {
            return toml::parse(file);
        }
        return loadTomlStr(tomlString);
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}